

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O2

_Bool extent_purge_forced_impl
                (tsdn_t *tsdn,ehooks_t *ehooks,edata_t *edata,size_t offset,size_t length,
                _Bool growing_retained)

{
  _Bool _Var1;
  
  _Var1 = ehooks_purge_forced(tsdn,ehooks,(void *)((ulong)edata->e_addr & 0xfffffffffffff000),
                              (edata->field_2).e_size_esn & 0xfffffffffffff000,offset,length);
  return _Var1;
}

Assistant:

static bool
extent_purge_forced_impl(tsdn_t *tsdn, ehooks_t *ehooks, edata_t *edata,
    size_t offset, size_t length, bool growing_retained) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, growing_retained ? 1 : 0);
	bool err = ehooks_purge_forced(tsdn, ehooks, edata_base_get(edata),
	    edata_size_get(edata), offset, length);
	return err;
}